

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O3

void wallet::MaybePushAddress(UniValue *entry,CTxDestination *dest)

{
  string key;
  UniValue val;
  bool bVar1;
  long in_FS_OFFSET;
  _Alloc_hider in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  _Alloc_hider in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88 [56];
  long *local_40 [2];
  long local_30 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsValidDestination(dest);
  if (bVar1) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"address","");
    EncodeDestination_abi_cxx11_((string *)&stack0xffffffffffffff48,dest);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)&stack0xffffffffffffff68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff48);
    key._M_string_length = in_stack_ffffffffffffff50;
    key._M_dataplus._M_p = in_stack_ffffffffffffff48._M_p;
    key.field_2._M_allocated_capacity = in_stack_ffffffffffffff58;
    key.field_2._8_8_ = in_stack_ffffffffffffff60;
    val.val._M_dataplus._M_p = in_stack_ffffffffffffff70._M_p;
    val.typ = (VType)in_stack_ffffffffffffff68;
    val._4_4_ = SUB84(in_stack_ffffffffffffff68,4);
    val.val._M_string_length = in_stack_ffffffffffffff78;
    val.val.field_2._M_allocated_capacity = in_stack_ffffffffffffff80;
    val._32_56_ = in_stack_ffffffffffffff88;
    UniValue::pushKV(entry,key,val);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffffa8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff90);
    if (in_stack_ffffffffffffff70._M_p != &stack0xffffffffffffff80) {
      operator_delete(in_stack_ffffffffffffff70._M_p,in_stack_ffffffffffffff80 + 1);
    }
    if (in_stack_ffffffffffffff48._M_p != &stack0xffffffffffffff58) {
      operator_delete(in_stack_ffffffffffffff48._M_p,in_stack_ffffffffffffff58 + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void MaybePushAddress(UniValue & entry, const CTxDestination &dest)
{
    if (IsValidDestination(dest)) {
        entry.pushKV("address", EncodeDestination(dest));
    }
}